

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * String::fromBase64(String *__return_storage_ptr__,String *data)

{
  usize uVar1;
  usize uVar2;
  char *pcVar3;
  char *pcVar4;
  byte local_f8 [8];
  uchar base64de [123];
  uchar c;
  usize j;
  usize i;
  char *in;
  char *out;
  usize inlen;
  String result;
  String *data_local;
  
  result._data.ref = (usize)data;
  String((String *)&inlen);
  uVar1 = length((String *)result._data.ref);
  if ((uVar1 & 3) == 0) {
    uVar2 = length((String *)result._data.ref);
    reserve((String *)&inlen,uVar2);
    pcVar3 = operator_cast_to_char_((String *)&inlen);
    pcVar4 = operator_cast_to_char_((String *)result._data.ref);
    memcpy(local_f8,&DAT_00111b50,0x7b);
    stack0xffffffffffffff88 = 0;
    for (j = 0; uVar2 = stack0xffffffffffffff88, j < uVar1; j = j + 1) {
      if ('z' < pcVar4[j]) {
        String(__return_storage_ptr__);
        goto LAB_00110252;
      }
      base64de[0x77] = local_f8[(byte)pcVar4[j]];
      if (base64de[0x77] == 0xff) {
        if (pcVar4[j] != '=') {
          String(__return_storage_ptr__);
          goto LAB_00110252;
        }
        break;
      }
      switch((uint)j & 3) {
      case 0:
        pcVar3[stack0xffffffffffffff88] = base64de[0x77] << 2;
        break;
      case 1:
        register0x00000010 = stack0xffffffffffffff88 + 1;
        pcVar3[uVar2] = pcVar3[uVar2] | (byte)((int)(uint)base64de[0x77] >> 4) & 3;
        pcVar3[register0x00000010] = base64de[0x77] << 4;
        break;
      case 2:
        register0x00000010 = stack0xffffffffffffff88 + 1;
        pcVar3[uVar2] = pcVar3[uVar2] | (byte)((int)(uint)base64de[0x77] >> 2) & 0xf;
        pcVar3[register0x00000010] = base64de[0x77] << 6;
        break;
      case 3:
        stack0xffffffffffffff88 = stack0xffffffffffffff88 + 1;
        pcVar3[uVar2] = pcVar3[uVar2] | base64de[0x77];
      }
    }
    resize((String *)&inlen,stack0xffffffffffffff88);
    String(__return_storage_ptr__,(String *)&inlen);
  }
  else {
    String(__return_storage_ptr__);
  }
LAB_00110252:
  ~String((String *)&inlen);
  return __return_storage_ptr__;
}

Assistant:

String String::fromBase64(const String& data)
{
    String result;
    usize inlen = data.length();
    if (inlen & 0x3)
        return String();
    result.reserve(data.length());
    char* out = (char*)result;
    const char* in = (const char*)data;
    usize i;
    usize j;
    unsigned char c;
    const unsigned char base64de[] = {
        /* nul, soh, stx, etx, eot, enq, ack, bel, */
           255, 255, 255, 255, 255, 255, 255, 255,
    
        /*  bs,  ht,  nl,  vt,  np,  cr,  so,  si, */
           255, 255, 255, 255, 255, 255, 255, 255,
    
        /* dle, dc1, dc2, dc3, dc4, nak, syn, etb, */
           255, 255, 255, 255, 255, 255, 255, 255,
    
        /* can,  em, sub, esc,  fs,  gs,  rs,  us, */
           255, 255, 255, 255, 255, 255, 255, 255,
    
        /*  sp, '!', '"', '#', '$', '%', '&', ''', */
           255, 255, 255, 255, 255, 255, 255, 255,
    
        /* '(', ')', '*', '+', ',', '-', '.', '/', */
           255, 255, 255,  62, 255, 255, 255,  63,
    
        /* '0', '1', '2', '3', '4', '5', '6', '7', */
            52,  53,  54,  55,  56,  57,  58,  59,
    
        /* '8', '9', ':', ';', '<', '=', '>', '?', */
            60,  61, 255, 255, 255, 255, 255, 255,
    
        /* '@', 'A', 'B', 'C', 'D', 'E', 'F', 'G', */
           255,   0,   1,  2,   3,   4,   5,    6,
    
        /* 'H', 'I', 'J', 'K', 'L', 'M', 'N', 'O', */
             7,   8,   9,  10,  11,  12,  13,  14,
    
        /* 'P', 'Q', 'R', 'S', 'T', 'U', 'V', 'W', */
            15,  16,  17,  18,  19,  20,  21,  22,
    
        /* 'X', 'Y', 'Z', '[', '\', ']', '^', '_', */
            23,  24,  25, 255, 255, 255, 255, 255,
    
        /* '`', 'a', 'b', 'c', 'd', 'e', 'f', 'g', */
           255,  26,  27,  28,  29,  30,  31,  32,
    
        /* 'h', 'i', 'j', 'k', 'l', 'm', 'n', 'o', */
            33,  34,  35,  36,  37,  38,  39,  40,
    
        /* 'p', 'q', 'r', 's', 't', 'u', 'v', 'w', */
            41,  42,  43,  44,  45,  46,  47,  48,
    
        /* 'x', 'y', 'z', '{', '|', '}', '~', del, */
            49,  50,  51//, 255, 255, 255, 255, 255
    };
    for (i = j = 0; i < inlen; ++i)
    {
        if (in[i] > 'z') 
            return String();

        c = base64de[(unsigned char)in[i]];
        if (c == 255)
        {
            if (in[i] == '=')
                break;

            return String();
        }

        switch (i & 0x3)
        {
        case 0:
            out[j] = (c << 2) & 0xFF;
            break;
        case 1:
            out[j++] |= (c >> 4) & 0x3;
            out[j] = (c & 0xF) << 4; 
            break;
        case 2:
            out[j++] |= (c >> 2) & 0xF;
            out[j] = (c & 0x3) << 6;
            break;
        case 3:
            out[j++] |= c;
            break;
        }
    }
    result.resize(j);
    return result;
}